

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

void SetLineIsoCoords(ON_Line *line,ON_3dPoint *P,ON_3dPoint *Q)

{
  bool bVar1;
  ON_3dPoint C;
  ON_3dPoint local_28;
  
  bVar1 = GetLineIsoCoordinates(line,*P,&local_28);
  if (bVar1) {
    if ((local_28.x != -1.23432101234321e+308) || (NAN(local_28.x))) {
      bVar1 = ON_IsValid(local_28.x);
      if (bVar1) {
        Q->x = P->x;
      }
    }
    if ((local_28.y != -1.23432101234321e+308) || (NAN(local_28.y))) {
      bVar1 = ON_IsValid(local_28.y);
      if (bVar1) {
        Q->y = P->y;
      }
    }
    if ((local_28.z != -1.23432101234321e+308) || (NAN(local_28.z))) {
      bVar1 = ON_IsValid(local_28.z);
      if (bVar1) {
        Q->z = P->z;
      }
    }
  }
  return;
}

Assistant:

static void SetLineIsoCoords( const ON_Line& line, const ON_3dPoint& P, ON_3dPoint& Q )
{
  ON_3dPoint C;
  if ( GetLineIsoCoordinates(line,P,C) )
  {
    if ( ON_UNSET_VALUE != C.x && ON_IsValid(C.x) )
      Q.x = P.x;
    if ( ON_UNSET_VALUE != C.y && ON_IsValid(C.y) )
      Q.y = P.y;
    if ( ON_UNSET_VALUE != C.z && ON_IsValid(C.z) )
      Q.z = P.z;
  }
}